

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesDiagnosticsGetTests
          (zes_diag_handle_t hDiagnostics,uint32_t *pCount,zes_diag_test_t *pTests)

{
  zes_pfnDiagnosticsGetTests_t pfnGetTests;
  ze_result_t result;
  zes_diag_test_t *pTests_local;
  uint32_t *pCount_local;
  zes_diag_handle_t hDiagnostics_local;
  
  pfnGetTests._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011ce08 != (code *)0x0) {
    pfnGetTests._4_4_ = (*DAT_0011ce08)(hDiagnostics,pCount,pTests);
  }
  return pfnGetTests._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDiagnosticsGetTests(
        zes_diag_handle_t hDiagnostics,                 ///< [in] Handle for the component.
        uint32_t* pCount,                               ///< [in,out] pointer to the number of tests.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of tests that are available.
                                                        ///< if count is greater than the number of tests that are available, then
                                                        ///< the driver shall update the value with the correct number of tests.
        zes_diag_test_t* pTests                         ///< [in,out][optional][range(0, *pCount)] array of information about
                                                        ///< individual tests sorted by increasing value of the `index` member of ::zes_diag_test_t.
                                                        ///< if count is less than the number of tests that are available, then the
                                                        ///< driver shall only retrieve that number of tests.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetTests = context.zesDdiTable.Diagnostics.pfnGetTests;
        if( nullptr != pfnGetTests )
        {
            result = pfnGetTests( hDiagnostics, pCount, pTests );
        }
        else
        {
            // generic implementation
        }

        return result;
    }